

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_tai.cpp
# Opt level: O0

caltime * __thiscall Kumu::TAI::caltime::operator=(caltime *this,tai *rhs)

{
  tai *rhs_local;
  caltime *this_local;
  
  caltime_utc(this,rhs);
  return this;
}

Assistant:

const Kumu::TAI::caltime&
Kumu::TAI::caltime::operator=(const Kumu::TAI::tai& rhs)
{
  caltime_utc(this, &rhs);
  return *this;
}